

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_genkey.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  FILE *__stream;
  FILE *fout;
  char *__format;
  mbedtls_rsa_context rsa;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  mbedtls_rsa_context mStack_6d8;
  mbedtls_ctr_drbg_context local_588;
  mbedtls_entropy_context local_430;
  
  mbedtls_ctr_drbg_init(&local_588);
  printf("\n  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_entropy_init(&local_430);
  uVar1 = mbedtls_ctr_drbg_seed(&local_588,mbedtls_entropy_func,&local_430,(uchar *)"rsa_genkey",10)
  ;
  if (uVar1 == 0) {
    printf(" ok\n  . Generating the RSA key [ %d-bit ]...");
    fflush(_stdout);
    mbedtls_rsa_init(&mStack_6d8,0,0);
    uVar1 = mbedtls_rsa_gen_key(&mStack_6d8,mbedtls_ctr_drbg_random,&local_588,0x800,0x10001);
    if (uVar1 == 0) {
      printf(" ok\n  . Exporting the public  key in rsa_pub.txt....");
      fflush(_stdout);
      __stream = fopen("rsa_pub.txt","wb+");
      if (__stream == (FILE *)0x0) {
        puts(" failed\n  ! could not open rsa_pub.txt for writing\n");
        uVar1 = 1;
        goto LAB_001063ac;
      }
      uVar1 = mbedtls_mpi_write_file("N = ",&mStack_6d8.N,0x10,(FILE *)__stream);
      if (uVar1 == 0) {
        uVar1 = mbedtls_mpi_write_file("E = ",&mStack_6d8.E,0x10,(FILE *)__stream);
        if (uVar1 != 0) goto LAB_00106454;
        printf(" ok\n  . Exporting the private key in rsa_priv.txt...");
        fflush(_stdout);
        fout = fopen("rsa_priv.txt","wb+");
        if (fout == (FILE *)0x0) {
          puts(" failed\n  ! could not open rsa_priv.txt for writing");
          uVar1 = 1;
        }
        else {
          uVar1 = mbedtls_mpi_write_file("N = ",&mStack_6d8.N,0x10,(FILE *)fout);
          if (((((uVar1 == 0) &&
                (uVar1 = mbedtls_mpi_write_file("E = ",&mStack_6d8.E,0x10,(FILE *)fout), uVar1 == 0)
                ) && (uVar1 = mbedtls_mpi_write_file("D = ",&mStack_6d8.D,0x10,(FILE *)fout),
                     uVar1 == 0)) &&
              ((uVar1 = mbedtls_mpi_write_file("P = ",&mStack_6d8.P,0x10,(FILE *)fout), uVar1 == 0
               && (uVar1 = mbedtls_mpi_write_file("Q = ",&mStack_6d8.Q,0x10,(FILE *)fout),
                  uVar1 == 0)))) &&
             ((uVar1 = mbedtls_mpi_write_file("DP = ",&mStack_6d8.DP,0x10,(FILE *)fout), uVar1 == 0
              && ((uVar1 = mbedtls_mpi_write_file("DQ = ",&mStack_6d8.DQ,0x10,(FILE *)fout),
                  uVar1 == 0 &&
                  (uVar1 = mbedtls_mpi_write_file("QP = ",&mStack_6d8.QP,0x10,(FILE *)fout),
                  uVar1 == 0)))))) {
            puts(" ok\n");
            uVar1 = 0;
          }
          else {
            printf(" failed\n  ! mbedtls_mpi_write_file returned %d\n\n",(ulong)uVar1);
          }
          fclose(__stream);
          __stream = fout;
        }
      }
      else {
LAB_00106454:
        printf(" failed\n  ! mbedtls_mpi_write_file returned %d\n\n",(ulong)uVar1);
      }
      fclose(__stream);
      goto LAB_001063ac;
    }
    __format = " failed\n  ! mbedtls_rsa_gen_key returned %d\n\n";
  }
  else {
    __format = " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n";
  }
  printf(__format,(ulong)uVar1);
LAB_001063ac:
  mbedtls_rsa_free(&mStack_6d8);
  mbedtls_ctr_drbg_free(&local_588);
  mbedtls_entropy_free(&local_430);
  return uVar1;
}

Assistant:

int main( void )
{
    int ret;
    mbedtls_rsa_context rsa;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    FILE *fpub  = NULL;
    FILE *fpriv = NULL;
    const char *pers = "rsa_genkey";

    mbedtls_ctr_drbg_init( &ctr_drbg );

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Generating the RSA key [ %d-bit ]...", KEY_SIZE );
    fflush( stdout );

    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );

    if( ( ret = mbedtls_rsa_gen_key( &rsa, mbedtls_ctr_drbg_random, &ctr_drbg, KEY_SIZE,
                             EXPONENT ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_gen_key returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Exporting the public  key in rsa_pub.txt...." );
    fflush( stdout );

    if( ( fpub = fopen( "rsa_pub.txt", "wb+" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! could not open rsa_pub.txt for writing\n\n" );
        ret = 1;
        goto exit;
    }

    if( ( ret = mbedtls_mpi_write_file( "N = ", &rsa.N, 16, fpub ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "E = ", &rsa.E, 16, fpub ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_file returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Exporting the private key in rsa_priv.txt..." );
    fflush( stdout );

    if( ( fpriv = fopen( "rsa_priv.txt", "wb+" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! could not open rsa_priv.txt for writing\n" );
        ret = 1;
        goto exit;
    }

    if( ( ret = mbedtls_mpi_write_file( "N = " , &rsa.N , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "E = " , &rsa.E , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "D = " , &rsa.D , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "P = " , &rsa.P , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "Q = " , &rsa.Q , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "DP = ", &rsa.DP, 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "DQ = ", &rsa.DQ, 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "QP = ", &rsa.QP, 16, fpriv ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_file returned %d\n\n", ret );
        goto exit;
    }
/*
    mbedtls_printf( " ok\n  . Generating the certificate..." );

    x509write_init_raw( &cert );
    x509write_add_pubkey( &cert, &rsa );
    x509write_add_subject( &cert, "CN='localhost'" );
    x509write_add_validity( &cert, "2007-09-06 17:00:32",
                                   "2010-09-06 17:00:32" );
    x509write_create_selfsign( &cert, &rsa );
    x509write_crtfile( &cert, "cert.der", X509_OUTPUT_DER );
    x509write_crtfile( &cert, "cert.pem", X509_OUTPUT_PEM );
    x509write_free_raw( &cert );
*/
    mbedtls_printf( " ok\n\n" );

exit:

    if( fpub  != NULL )
        fclose( fpub );

    if( fpriv != NULL )
        fclose( fpriv );

    mbedtls_rsa_free( &rsa );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}